

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File_Utilities.cpp
# Opt level: O0

istream * Nova::File_Utilities::Safe_Open_Input(string *filename,bool binary)

{
  ifstream *this;
  char *pcVar1;
  ostream *poVar2;
  istream *input;
  openmode flags;
  bool binary_local;
  string *filename_local;
  
  input._0_4_ = _S_in;
  input._7_1_ = binary;
  _flags = filename;
  if (binary) {
    std::operator|=((_Ios_Openmode *)&input,_S_bin);
  }
  this = (ifstream *)operator_new(0x208);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(this,pcVar1,(_Ios_Openmode)input);
  if (this != (ifstream *)0x0) {
    return (istream *)this;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Can\'t open ");
  poVar2 = std::operator<<(poVar2,(string *)_flags);
  poVar2 = std::operator<<(poVar2," for read ");
  pcVar1 = "";
  if ((input._7_1_ & 1) != 0) {
    pcVar1 = "binary";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

std::istream* Safe_Open_Input(const std::string& filename,bool binary)
    {
        std::ios_base::openmode flags=std::ios::in;
        if(binary) flags|=std::ios::binary;
        std::istream* input=new std::ifstream(filename.c_str(),flags);
        if(input!=nullptr) return input;
        std::cerr<<"Can't open "<<filename<<" for read "<<(binary?"binary":"")<<std::endl;
        exit(0);
    }